

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout_json.c
# Opt level: O2

void jsonWriteString(FILE *stream,char *in,_Bool lowercase)

{
  int iVar1;
  size_t len;
  size_t sVar2;
  char *__s;
  dynbuf out;
  
  curlx_dyn_init(&out,100000);
  len = strlen(in);
  iVar1 = jsonquoted(in,len,&out,lowercase);
  if (iVar1 == 0) {
    fputc(0x22,(FILE *)stream);
    sVar2 = curlx_dyn_len(&out);
    if (sVar2 != 0) {
      __s = curlx_dyn_ptr(&out);
      fputs(__s,(FILE *)stream);
    }
    fputc(0x22,(FILE *)stream);
  }
  curlx_dyn_free(&out);
  return;
}

Assistant:

void jsonWriteString(FILE *stream, const char *in, bool lowercase)
{
  struct curlx_dynbuf out;
  curlx_dyn_init(&out, MAX_JSON_STRING);

  if(!jsonquoted(in, strlen(in), &out, lowercase)) {
    fputc('\"', stream);
    if(curlx_dyn_len(&out))
      fputs(curlx_dyn_ptr(&out), stream);
    fputc('\"', stream);
  }
  curlx_dyn_free(&out);
}